

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

Vta_Man_t * Vga_ManStart(Gia_Man_t *pGia,Abs_Par_t *pPars)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  Vta_Man_t *pVVar5;
  Vta_Obj_t *pVVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  Vec_Bit_t *pVVar9;
  Vec_Ptr_t *pVVar10;
  sat_solver2 *psVar11;
  Vec_Set_t *pVVar12;
  word **ppwVar13;
  word *pwVar14;
  int iVar15;
  size_t __size;
  
  pVVar5 = (Vta_Man_t *)calloc(1,0xa8);
  pVVar5->pGia = pGia;
  pVVar5->pPars = pPars;
  pVVar5->nObjsAlloc = 0x40000;
  pVVar6 = (Vta_Obj_t *)calloc(0x40000,0x10);
  pVVar5->pObjs = pVVar6;
  pVVar5->nObjs = 1;
  iVar3 = Abc_PrimeCudd(0x80000);
  pVVar5->nBins = iVar3;
  piVar7 = (int *)calloc((long)iVar3,4);
  pVVar5->pBins = piVar7;
  pVVar8 = Vec_IntAlloc(0x3f5);
  pVVar5->vOrder = pVVar8;
  iVar3 = pGia->nObjs;
  iVar15 = iVar3;
  if (1 < (ulong)(long)iVar3) {
    iVar15 = 0;
    for (uVar4 = iVar3 - 1; uVar4 != 0; uVar4 = uVar4 >> 1) {
      iVar15 = iVar15 + 1;
    }
  }
  pVVar5->nObjBits = iVar15;
  uVar4 = ~(-1 << ((byte)iVar15 & 0x1f));
  pVVar5->nObjMask = uVar4;
  if (iVar3 <= (int)uVar4) {
    pVVar5->nWords = 1;
    pVVar8 = Vec_IntAlloc(iVar3);
    pVVar8->nSize = iVar3;
    __size = 0;
    memset(pVVar8->pArray,0,(long)iVar3 << 2);
    pVVar5->vSeens = pVVar8;
    iVar3 = ((pGia->nObjs >> 5) + 1) - (uint)((pGia->nObjs & 0x1fU) == 0);
    pVVar9 = (Vec_Bit_t *)malloc(0x10);
    pVVar9->nCap = iVar3 * 0x20;
    if (iVar3 == 0) {
      piVar7 = (int *)0x0;
    }
    else {
      __size = (long)iVar3 << 2;
      piVar7 = (int *)malloc(__size);
    }
    pVVar9->pArray = piVar7;
    pVVar9->nSize = iVar3 * 0x20;
    memset(piVar7,0,__size);
    pVVar5->vSeenGla = pVVar9;
    pVVar5->nSeenGla = 1;
    pVVar5->nSeenAll = 1;
    pVVar10 = Vec_PtrAlloc(100);
    pVVar5->vCores = pVVar10;
    psVar11 = sat_solver2_new();
    pVVar5->pSat = psVar11;
    pVVar12 = (Vec_Set_t *)calloc(1,0x20);
    pVVar12->nPageSize = 0x14;
    pVVar12->uPageMask = 0xfffff;
    pVVar12->nPagesAlloc = 0x100;
    ppwVar13 = (word **)calloc(0x100,8);
    pVVar12->pPages = ppwVar13;
    pwVar14 = (word *)malloc(0x800000);
    *ppwVar13 = pwVar14;
    pwVar14[1] = 0xffffffffffffffff;
    *pwVar14 = 2;
    psVar11->pPrf1 = pVVar12;
    uVar1 = pPars->nLearnedDelta;
    uVar2 = pPars->nLearnedPerce;
    iVar3 = pPars->nLearnedStart;
    psVar11->nLearntMax = iVar3;
    psVar11->nLearntStart = iVar3;
    psVar11->nLearntDelta = uVar1;
    psVar11->nLearntRatio = uVar2;
    if (pGia->vObjClasses != (Vec_Int_t *)0x0) {
      pVVar10 = Gia_VtaAbsToFrames(pGia->vObjClasses);
      pVVar5->vFrames = pVVar10;
      pVVar8 = Vec_IntAlloc(1000);
      pVVar5->vAddedNew = pVVar8;
      return pVVar5;
    }
    __assert_fail("pGia->vObjClasses != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                  ,0x3f8,"Vta_Man_t *Vga_ManStart(Gia_Man_t *, Abs_Par_t *)");
  }
  __assert_fail("Gia_ManObjNum(pGia) <= (int)p->nObjMask",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                ,999,"Vta_Man_t *Vga_ManStart(Gia_Man_t *, Abs_Par_t *)");
}

Assistant:

Vta_Man_t * Vga_ManStart( Gia_Man_t * pGia, Abs_Par_t * pPars )
{
    Vta_Man_t * p;
    p = ABC_CALLOC( Vta_Man_t, 1 );
    p->pGia        = pGia;
    p->pPars       = pPars;
    // internal data
    p->nObjsAlloc  = (1 << 18);
    p->pObjs       = ABC_CALLOC( Vta_Obj_t, p->nObjsAlloc );
    p->nObjs       = 1;
    p->nBins       = Abc_PrimeCudd( 2*p->nObjsAlloc );
    p->pBins       = ABC_CALLOC( int, p->nBins );
    p->vOrder      = Vec_IntAlloc( 1013 );
    // abstraction
    p->nObjBits    = Abc_Base2Log( Gia_ManObjNum(pGia) );
    p->nObjMask    = (1 << p->nObjBits) - 1;
    assert( Gia_ManObjNum(pGia) <= (int)p->nObjMask );
    p->nWords      = 1;
    p->vSeens      = Vec_IntStart( Gia_ManObjNum(pGia) * p->nWords );
    p->vSeenGla    = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->nSeenGla    = 1;
    p->nSeenAll    = 1;
    // other data
    p->vCores      = Vec_PtrAlloc( 100 );
    p->pSat        = sat_solver2_new();
    p->pSat->pPrf1 = Vec_SetAlloc( 20 );
//    p->pSat->fVerbose = p->pPars->fVerbose;
//    sat_solver2_set_learntmax( p->pSat, pPars->nLearnedMax );
    p->pSat->nLearntStart = p->pPars->nLearnedStart;
    p->pSat->nLearntDelta = p->pPars->nLearnedDelta;
    p->pSat->nLearntRatio = p->pPars->nLearnedPerce;
    p->pSat->nLearntMax   = p->pSat->nLearntStart;
    // start the abstraction
    assert( pGia->vObjClasses != NULL );
    p->vFrames = Gia_VtaAbsToFrames( pGia->vObjClasses );
    p->vAddedNew   = Vec_IntAlloc( 1000 );
    return p;
}